

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::injected_class_member::test_method(injected_class_member *this)

{
  int iVar1;
  injected<Inject::service> *this_00;
  service *psVar2;
  undefined4 extraout_var;
  component<Inject::with_injected_member> b4;
  component<Inject::impl1> b2;
  component<Inject::service> b1;
  undefined8 local_100;
  injected<Inject::with_injected_member> p;
  char *local_e8;
  char *local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined8 *local_c8;
  char *local_c0;
  unique_id local_b8;
  provides<Inject::with_injected_member> b5;
  provides<Inject::service> b3;
  char *local_90;
  char *local_88;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&b1);
  inject::context<0>::component<Inject::impl1>::component(&b2);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&b3);
  inject::context<0>::component<Inject::with_injected_member>::component(&b4);
  inject::context<0>::component<Inject::with_injected_member>::
  provides<Inject::with_injected_member>::provides(&b5);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::
  bind<Inject::with_injected_member,Inject::with_injected_member,(inject::component_scope)0>(&c);
  inject::context<0>::injected<Inject::with_injected_member>::injected(&p);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_88 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x1a0);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_0015fea8;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e0 = "";
  this_00 = &inject::context<0>::injected<Inject::with_injected_member>::operator->(&p)->my_service;
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(this_00);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_100 = CONCAT44(extraout_var,iVar1);
  local_b8 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_d8,&local_e8,0x1a0,1,2,&local_100,"p->my_service->id()",&local_b8,
             "id_of<impl1>::id()");
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::with_injected_member>::~component(&b4);
  inject::context<0>::component<Inject::impl1>::~component(&b2);
  inject::context<0>::component<Inject::service>::~component(&b1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(injected_class_member)
{
    context<>::component<service> b1;
    context<>::component<impl1> b2;
    context<>::component<impl1>::provides<service> b3;
    context<>::component<with_injected_member> b4;
    context<>::component<with_injected_member>::provides<with_injected_member> b5;

    context<> c;
    
    c.bind<service, impl1>();
    c.bind<with_injected_member>();

    context<>::injected<with_injected_member> p;
    BOOST_CHECK_EQUAL(p->my_service->id(), id_of<impl1>::id());
}